

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
* __thiscall TaprootBuilder::GetTreeTuples(TaprootBuilder *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  uchar *in_RSI;
  TaprootBuilder *in_RDI;
  long in_FS_OFFSET;
  LeafInfo *leaf;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *__range2;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *leaves;
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *tuples;
  uint8_t leaf_ver;
  uint8_t depth;
  const_iterator __end2;
  const_iterator __begin2;
  optional<TaprootBuilder::NodeInfo> *in_stack_ffffffffffffff78;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
  *in_stack_ffffffffffffff80;
  TaprootBuilder *__args_2;
  uchar *in_stack_ffffffffffffffa0;
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __args_2 = in_RDI;
  bVar2 = IsComplete(in_RDI);
  if (!bVar2) {
    __assert_fail("IsComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x236,
                  "std::vector<std::tuple<uint8_t, uint8_t, std::vector<unsigned char>>> TaprootBuilder::GetTreeTuples() const"
                 );
  }
  std::
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::vector((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)in_stack_ffffffffffffff78);
  sVar3 = std::
          vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)in_stack_ffffffffffffff78);
  if (sVar3 != 0) {
    std::
    vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)in_RDI,(size_type)in_stack_ffffffffffffff80);
    std::optional<TaprootBuilder::NodeInfo>::operator->(in_stack_ffffffffffffff78);
    std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::begin
              (in_stack_ffffffffffffff80);
    std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::end
              (in_stack_ffffffffffffff80);
    while (bVar2 = __gnu_cxx::
                   operator==<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                             ((__normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                               *)in_stack_ffffffffffffff80), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
      ::operator*((__normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                   *)in_stack_ffffffffffffff78);
      sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff78);
      if (0x80 < sVar3) {
        __assert_fail("leaf.merkle_branch.size() <= TAPROOT_CONTROL_MAX_NODE_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                      ,0x23b,
                      "std::vector<std::tuple<uint8_t, uint8_t, std::vector<unsigned char>>> TaprootBuilder::GetTreeTuples() const"
                     );
      }
      std::vector<uint256,_std::allocator<uint256>_>::size
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff78);
      std::
      vector<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
      ::
      emplace_back<unsigned_char&,unsigned_char&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RSI,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__args_2);
      __gnu_cxx::
      __normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
      ::operator++((__normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                    *)in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)__args_2;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::tuple<uint8_t, uint8_t, std::vector<unsigned char>>> TaprootBuilder::GetTreeTuples() const
{
    assert(IsComplete());
    std::vector<std::tuple<uint8_t, uint8_t, std::vector<unsigned char>>> tuples;
    if (m_branch.size()) {
        const auto& leaves = m_branch[0]->leaves;
        for (const auto& leaf : leaves) {
            assert(leaf.merkle_branch.size() <= TAPROOT_CONTROL_MAX_NODE_COUNT);
            uint8_t depth = (uint8_t)leaf.merkle_branch.size();
            uint8_t leaf_ver = (uint8_t)leaf.leaf_version;
            tuples.emplace_back(depth, leaf_ver, leaf.script);
        }
    }
    return tuples;
}